

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O1

Reference __thiscall
mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,_ExprCounter>::ReadReference
          (NLReader<mp::internal::TextReader<fmt::Locale>,_ExprCounter> *this)

{
  TextReader<fmt::Locale> *this_00;
  char *loc;
  undefined8 local_28;
  undefined8 uStack_20;
  ArgList local_18;
  
  this_00 = this->reader_;
  loc = (this_00->super_ReaderBase).ptr_;
  (this_00->super_ReaderBase).token_ = loc;
  (this_00->super_ReaderBase).ptr_ = loc + 1;
  if (*loc != 'v') {
    local_28 = 0;
    uStack_20 = 0;
    local_18.types_ = 0;
    local_18.field_1.values_ = (Value *)&local_28;
    TextReader<fmt::Locale>::DoReportError(this_00,loc,(CStringRef)0x139f7e,&local_18);
  }
  ReadUInt(this,this->num_vars_and_exprs_);
  TextReader<fmt::Locale>::ReadTillEndOfLine(this->reader_);
  return OTHER;
}

Assistant:

Reference ReadReference() {
    if (reader_.ReadChar() != 'v')
      reader_.ReportError("expected reference");
    return DoReadReference();
  }